

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O2

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedFeature(DiagnosticsReporter *this,string *name)

{
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  string local_98 [32];
  DiagnosticDescriptor local_78;
  
  std::__cxx11::string::string(local_98,(string *)&ID_of_ExpectedFeature_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"[[unexpected extension or C dialect]]",&local_d9);
  std::operator+(&local_d8,name," is either an extension or unsupported in this dialect");
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_78,local_98,local_b8,&local_d8,1,1);
  diagnoseOrDelayDiagnostic(this,&local_78);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedFeature(const std::string& name)
{
    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_ExpectedFeature,
                                     "[[unexpected extension or C dialect]]",
                                     name + " is either an extension or unsupported in this dialect",
                                     DiagnosticSeverity::Warning,
                                     DiagnosticCategory::Syntax));
}